

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O2

void ScaleUVRowDownEvenBox_C
               (uint8_t *src_uv,ptrdiff_t src_stride,int src_stepx,uint8_t *dst_uv,int dst_width)

{
  long lVar1;
  byte *pbVar2;
  
  lVar1 = 0;
  if (dst_width < 1) {
    dst_width = 0;
  }
  pbVar2 = src_uv + 3;
  for (; dst_width != (int)lVar1; lVar1 = lVar1 + 1) {
    dst_uv[lVar1 * 2] =
         (uint8_t)((uint)pbVar2[src_stride + -3] + (uint)pbVar2[-1] + (uint)pbVar2[-3] +
                   (uint)pbVar2[src_stride + -1] + 2 >> 2);
    dst_uv[lVar1 * 2 + 1] =
         (uint8_t)((uint)pbVar2[src_stride + -2] + (uint)*pbVar2 + (uint)pbVar2[-2] +
                   (uint)pbVar2[src_stride] + 2 >> 2);
    pbVar2 = pbVar2 + src_stepx * 2;
  }
  return;
}

Assistant:

void ScaleUVRowDownEvenBox_C(const uint8_t* src_uv,
                             ptrdiff_t src_stride,
                             int src_stepx,
                             uint8_t* dst_uv,
                             int dst_width) {
  int x;
  for (x = 0; x < dst_width; ++x) {
    dst_uv[0] = (src_uv[0] + src_uv[2] + src_uv[src_stride] +
                 src_uv[src_stride + 2] + 2) >>
                2;
    dst_uv[1] = (src_uv[1] + src_uv[3] + src_uv[src_stride + 1] +
                 src_uv[src_stride + 3] + 2) >>
                2;
    src_uv += src_stepx * 2;
    dst_uv += 2;
  }
}